

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void crnlib::split_vectors<crnlib::vec<3u,float>>
               (vec<3U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<3U,_float> (*result) [2])

{
  uint uVar1;
  undefined8 uVar2;
  uint i_2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  undefined8 *puVar6;
  vec<3U,_float> *pvVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  vec<3U,_float> *pvVar11;
  undefined8 *puVar12;
  uint i_1;
  uint i;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint i_23;
  ulong uVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  double sum;
  float dist2;
  float fVar20;
  float fVar21;
  float dist2_2;
  float fVar22;
  float dist2_3;
  float fVar23;
  float fVar24;
  float fVar25;
  vec<3U,_float> axis;
  vec<3U,_float> centroid;
  vec<3U,_float> new_left_child;
  vec<3U,_float> result_8;
  vec<3U,_float> right_child;
  vec<3U,_float> left_child;
  vec<3U,_float> result_1;
  vec<3U,_float> new_right_child;
  vec<3U,_float> furthest;
  vec<3U,_float> opposite;
  double weightedDotProducts [64];
  vec<3U,_float> weightedVectors [64];
  undefined8 local_5f0;
  float local_5e8;
  undefined8 local_5e0;
  float local_5d8;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4 [3];
  undefined8 local_5b8;
  float local_5b0;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  ulong uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_578;
  float local_568 [4];
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  float local_540;
  double adStack_538 [64];
  undefined8 local_338;
  undefined4 local_330 [192];
  
  local_5d8 = 0.0;
  local_5e0 = 0;
  uVar16 = (ulong)size;
  dVar18 = 0.0;
  dVar19 = 0.0;
  if (size == 0) {
    local_5e0._4_4_ = 0.0;
    local_5e0._0_4_ = 0.0;
    fVar17 = 0.0;
  }
  else {
    puVar6 = &local_338;
    uVar8 = 0;
    uVar4 = 0;
    pvVar7 = *vectors;
    do {
      pvVar11 = *vectors + uVar8;
      uVar1 = (*weights)[uVar8];
      fVar17 = (float)uVar1;
      lVar13 = 0;
      do {
        *(float *)((long)&local_598 + lVar13 * 4) =
             ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13] * fVar17;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_330[uVar8 * 3] = (float)uStack_590;
      *(undefined8 *)((long)&local_338 + uVar8 * 0xc) = local_598;
      lVar13 = 0;
      do {
        *(float *)((long)&local_5e0 + lVar13 * 4) =
             *(float *)((long)puVar6 + lVar13 * 4) + *(float *)((long)&local_5e0 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      uVar4 = uVar4 + uVar1;
      dVar18 = (double)((pvVar11->m_s[2] * pvVar11->m_s[2] +
                        pvVar11->m_s[1] * pvVar11->m_s[1] + pvVar11->m_s[0] * pvVar11->m_s[0]) *
                       fVar17);
      adStack_538[uVar8] = dVar18;
      dVar19 = dVar19 + dVar18;
      uVar8 = uVar8 + 1;
      pvVar7 = pvVar7 + 1;
      puVar6 = (undefined8 *)((long)puVar6 + 0xc);
    } while (uVar8 != uVar16);
    fVar17 = (float)uVar4;
    dVar18 = dVar19;
  }
  fVar22 = (float)local_5e0 * (float)local_5e0;
  fVar21 = local_5e0._4_4_ * local_5e0._4_4_;
  fVar20 = local_5d8 * local_5d8;
  lVar13 = 0;
  do {
    *(float *)((long)&local_5e0 + lVar13 * 4) =
         *(float *)((long)&local_5e0 + lVar13 * 4) * (1.0 / fVar17);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  (*result)[1].m_s[2] = local_5d8;
  *(undefined8 *)(*result)[1].m_s = local_5e0;
  *(undefined8 *)(*result)[0].m_s = local_5e0;
  (*result)[0].m_s[2] = local_5d8;
  if ((size != 1) && (0.0 < (float)(dVar18 - (double)((fVar20 + fVar21 + fVar22) / fVar17)))) {
    if (size != 0) {
      fVar20 = -1.0;
      uVar4 = 0;
      pvVar7 = *vectors;
      do {
        fVar21 = 0.0;
        lVar13 = 0;
        do {
          fVar22 = ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13] -
                   *(float *)((long)&local_5e0 + lVar13 * 4);
          fVar21 = fVar21 + fVar22 * fVar22;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        if (fVar20 < fVar21) {
          local_550 = (*vectors)[uVar4].m_s[2];
          local_558 = *(undefined8 *)(*vectors)[uVar4].m_s;
          fVar20 = fVar21;
        }
        uVar4 = uVar4 + 1;
        pvVar7 = pvVar7 + 1;
      } while (uVar4 != uVar16);
      if (size != 0) {
        fVar20 = -1.0;
        uVar4 = 0;
        pvVar7 = *vectors;
        do {
          fVar21 = 0.0;
          lVar13 = 0;
          do {
            fVar22 = ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13] -
                     *(float *)((long)&local_558 + lVar13 * 4);
            fVar21 = fVar21 + fVar22 * fVar22;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          if (fVar20 < fVar21) {
            local_540 = (*vectors)[uVar4].m_s[2];
            local_548 = *(undefined8 *)(*vectors)[uVar4].m_s;
            fVar20 = fVar21;
          }
          uVar4 = uVar4 + 1;
          pvVar7 = pvVar7 + 1;
        } while (uVar4 != uVar16);
      }
    }
    lVar13 = 0;
    do {
      *(float *)((long)&local_598 + lVar13 * 4) =
           *(float *)((long)&local_558 + lVar13 * 4) + *(float *)((long)&local_5e0 + lVar13 * 4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar13 = 0;
    do {
      *(float *)((long)&local_5a8 + lVar13 * 4) = *(float *)((long)&local_598 + lVar13 * 4) * 0.5;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar13 = 0;
    do {
      *(float *)((long)&local_598 + lVar13 * 4) =
           *(float *)((long)&local_548 + lVar13 * 4) + *(float *)((long)&local_5e0 + lVar13 * 4);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar13 = 0;
    do {
      *(float *)((long)&local_5b8 + lVar13 * 4) = *(float *)((long)&local_598 + lVar13 * 4) * 0.5;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (2 < size) {
      local_588 = 0;
      uStack_580 = 0;
      local_598 = 0;
      uStack_590 = 0;
      local_578 = 0;
      uVar4 = 0;
      pvVar7 = *vectors;
      do {
        lVar13 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar13 * 4) =
               ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13] -
               *(float *)((long)&local_5e0 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        uVar1 = (*weights)[uVar4];
        lVar13 = 0;
        do {
          *(float *)((long)&local_5d0 + lVar13 * 4) =
               *(float *)((long)&local_5f0 + lVar13 * 4) * (float)uVar1;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        puVar6 = &local_5d0;
        puVar12 = &local_598;
        do {
          fVar20 = *(float *)((long)&local_5f0 + lVar13 * 4);
          lVar14 = -3;
          do {
            *(float *)((long)puVar12 + lVar14 * 4 + 0xc) =
                 *(float *)((long)puVar6 + lVar14 * 4 + 0xc) * fVar20 +
                 *(float *)((long)puVar12 + lVar14 * 4 + 0xc);
            lVar14 = lVar14 + 1;
          } while (lVar13 + lVar14 != 0);
          lVar13 = lVar13 + 1;
          puVar12 = puVar12 + 2;
          puVar6 = (undefined8 *)((long)puVar6 + 4);
        } while (lVar13 != 3);
        uVar4 = uVar4 + 1;
        pvVar7 = pvVar7 + 1;
      } while (uVar4 != uVar16);
      pfVar5 = (float *)&local_598;
      lVar13 = 0x24;
      lVar14 = 0;
      do {
        lVar9 = 0;
        pfVar10 = pfVar5;
        do {
          fVar20 = *pfVar10;
          *pfVar10 = fVar20 / fVar17;
          *(float *)((long)pfVar5 + lVar9) = fVar20 / fVar17;
          pfVar10 = pfVar10 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar13 != lVar9);
        lVar14 = lVar14 + 1;
        pfVar5 = pfVar5 + 4;
        lVar13 = lVar13 + -0xc;
      } while (lVar14 != 3);
      local_5f0 = 0x3f8000003f800000;
      local_5e8 = 1.0;
      iVar3 = 0;
      do {
        lVar13 = 0;
        fVar17 = 0.0;
        puVar6 = &local_598;
        do {
          fVar20 = 0.0;
          lVar14 = 0;
          do {
            fVar20 = fVar20 + *(float *)((long)&local_5f0 + lVar14 * 4) *
                              *(float *)((long)puVar6 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          *(float *)((long)&local_5d0 + lVar13 * 4) = fVar20;
          fVar21 = fVar17;
          if (fVar17 <= fVar20) {
            fVar21 = fVar20;
          }
          fVar17 = fVar20;
          if (lVar13 != 0) {
            fVar17 = fVar21;
          }
          lVar13 = lVar13 + 1;
          puVar6 = (undefined8 *)((long)puVar6 + 0xc);
        } while (lVar13 != 3);
        if ((fVar21 != 0.0) || (NAN(fVar21))) {
          lVar13 = 0;
          do {
            *(float *)((long)&local_5d0 + lVar13 * 4) =
                 *(float *)((long)&local_5d0 + lVar13 * 4) * (1.0 / fVar21);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
        }
        local_5e8 = (float)local_5c8;
        local_5f0 = local_5d0;
        uVar2 = local_5f0;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 10);
      local_5f0._0_4_ = (float)local_5d0;
      dVar19 = (double)((float)local_5f0 * (float)local_5f0);
      lVar13 = 1;
      do {
        fVar17 = *(float *)((long)&local_5f0 + lVar13 * 4);
        dVar19 = dVar19 + (double)(fVar17 * fVar17);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        local_5f0 = uVar2;
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        lVar13 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar13 * 4) =
               *(float *)((long)&local_5f0 + lVar13 * 4) * (float)(1.0 / dVar19);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
      }
      dVar18 = 0.0;
      uVar4 = 0;
      local_5c8 = 0;
      local_5d0 = 0;
      local_568[2] = 0.0;
      local_568[0] = 0.0;
      local_568[1] = 0.0;
      puVar6 = &local_338;
      dVar19 = 0.0;
      pvVar7 = *vectors;
      do {
        uVar1 = (*weights)[uVar4];
        lVar13 = 0;
        do {
          local_5c4[lVar13] =
               ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13] -
               *(float *)((long)&local_5e0 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        fVar17 = local_5c4[0] * (float)local_5f0;
        lVar13 = 1;
        do {
          fVar17 = fVar17 + local_5c4[lVar13] * *(float *)((long)&local_5f0 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        if (0.0 <= fVar17) {
          do {
            local_568[lVar13] = *(float *)((long)puVar6 + lVar13 * 4) + local_568[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          dVar18 = dVar18 + (double)uVar1;
        }
        else {
          do {
            *(float *)((long)&local_5d0 + lVar13 * 4) =
                 *(float *)((long)puVar6 + lVar13 * 4) + *(float *)((long)&local_5d0 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          dVar19 = dVar19 + (double)uVar1;
        }
        uVar4 = uVar4 + 1;
        pvVar7 = pvVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (uVar4 != uVar16);
      if ((0.0 < dVar19) && (0.0 < dVar18)) {
        lVar13 = 0;
        do {
          local_5c4[lVar13] = *(float *)((long)&local_5d0 + lVar13 * 4) * (float)(1.0 / dVar19);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_5a0 = local_5c4[2];
        lVar13 = 0;
        do {
          local_5c4[lVar13] = local_568[lVar13] * (float)(1.0 / dVar18);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_5b0 = local_5c4[2];
      }
    }
    iVar3 = 0;
    fVar17 = 1e+10;
    do {
      uStack_590 = uStack_590 & 0xffffffff00000000;
      local_598 = 0;
      local_5e8 = 0.0;
      local_5f0 = 0;
      if (size == 0) {
        return;
      }
      dVar19 = 0.0;
      uVar15 = 0;
      dVar18 = 0.0;
      uVar4 = 0;
      uVar8 = 0;
      puVar6 = &local_338;
      pvVar7 = *vectors;
      do {
        fVar20 = 0.0;
        lVar13 = 0;
        do {
          fVar21 = *(float *)((long)&local_5a8 + lVar13 * 4) -
                   ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13];
          fVar20 = fVar20 + fVar21 * fVar21;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        fVar21 = 0.0;
        lVar13 = 0;
        do {
          fVar22 = *(float *)((long)&local_5b8 + lVar13 * 4) -
                   ((vec<3U,_float> *)pvVar7->m_s)->m_s[lVar13];
          fVar21 = fVar21 + fVar22 * fVar22;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar13 = 0;
        if (fVar21 <= fVar20) {
          do {
            *(float *)((long)&local_5f0 + lVar13 * 4) =
                 *(float *)((long)puVar6 + lVar13 * 4) + *(float *)((long)&local_5f0 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          dVar19 = dVar19 + adStack_538[uVar15];
          uVar4 = uVar4 + (*weights)[uVar15];
        }
        else {
          do {
            *(float *)((long)&local_598 + lVar13 * 4) =
                 *(float *)((long)puVar6 + lVar13 * 4) + *(float *)((long)&local_598 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          dVar18 = dVar18 + adStack_538[uVar15];
          uVar8 = uVar8 + (*weights)[uVar15];
        }
        uVar15 = uVar15 + 1;
        pvVar7 = pvVar7 + 1;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      } while (uVar15 != uVar16);
      if (uVar8 == 0) {
        return;
      }
      if (uVar4 == 0) {
        return;
      }
      fVar20 = (float)local_598 * (float)local_598;
      fVar24 = local_598._4_4_ * local_598._4_4_;
      fVar21 = (float)uStack_590 * (float)uStack_590;
      fVar22 = (float)local_5f0 * (float)local_5f0;
      fVar25 = local_5f0._4_4_ * local_5f0._4_4_;
      fVar23 = local_5e8 * local_5e8;
      lVar13 = 0;
      do {
        *(float *)((long)&local_598 + lVar13 * 4) =
             *(float *)((long)&local_598 + lVar13 * 4) * (1.0 / (float)uVar8);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar13 = 0;
      do {
        *(float *)((long)&local_5f0 + lVar13 * 4) =
             *(float *)((long)&local_5f0 + lVar13 * 4) * (1.0 / (float)uVar4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_5a0 = (float)uStack_590;
      local_5a8 = local_598;
      local_5b8 = local_5f0;
      local_5b0 = local_5e8;
      fVar20 = (float)(dVar18 - (double)((fVar21 + fVar24 + fVar20) / (float)uVar8)) +
               (float)(dVar19 - (double)((fVar23 + fVar25 + fVar22) / (float)uVar4));
    } while (((1e-05 <= fVar20) && (1e-05 <= (fVar17 - fVar20) / fVar20)) &&
            (iVar3 = iVar3 + 1, fVar17 = fVar20, iVar3 != 0x400));
    (*result)[0].m_s[2] = (float)uStack_590;
    *(undefined8 *)(*result)[0].m_s = local_598;
    (*result)[1].m_s[2] = local_5e8;
    *(undefined8 *)(*result)[1].m_s = local_5f0;
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }